

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

Token lexRawToken(string_view text)

{
  StringRef capturedExpression;
  StringRef macroName;
  string_view text_00;
  SourceManager *library;
  ExprLhs<slang::parsing::Token_&> this;
  undefined8 in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler;
  Lexer lexer;
  SourceBuffer buffer;
  SourceManager *sm;
  Token token;
  SourceLineInfo *lineInfo;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffb60;
  ExprLhs<slang::parsing::Token_&> *in_stack_fffffffffffffb78;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *in_stack_fffffffffffffb80;
  Flags resultDisposition;
  undefined1 *this_00;
  SourceLocation in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  SourceLineInfo local_420;
  StringRef local_410;
  LexerOptions *in_stack_fffffffffffffc08;
  SourceManager *in_stack_fffffffffffffc10;
  Diagnostics *in_stack_fffffffffffffc18;
  BumpAllocator *in_stack_fffffffffffffc20;
  Lexer *in_stack_fffffffffffffc28;
  SourceBuffer in_stack_fffffffffffffc40;
  SourceLocation local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  size_t local_48;
  Lexer *pLStack_40;
  char *local_38;
  size_type sStack_30;
  SourceManager *local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  Token local_10;
  
  this_00 = slang::diagnostics;
  local_20 = in_RDI;
  uStack_18 = in_RSI;
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffffb60);
  library = getSourceManager();
  local_58 = local_20;
  uStack_50 = uStack_18;
  local_28 = library;
  slang::SourceLocation::SourceLocation(&local_60);
  text_00._M_str = in_stack_fffffffffffffbc0;
  text_00._M_len = in_stack_fffffffffffffbb8;
  slang::SourceManager::assignText
            ((SourceManager *)this_00,text_00,in_stack_fffffffffffffbb0,(SourceLibrary *)library);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::unordered_flat_map(in_stack_fffffffffffffb80);
  slang::parsing::Lexer::Lexer
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc40,in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  slang::parsing::LexerOptions::~LexerOptions((LexerOptions *)0x19ddc7);
  local_10 = slang::parsing::Lexer::lex(pLStack_40);
  resultDisposition = (Flags)local_10.info;
  local_410 = operator____catch_sr((char *)pLStack_40,local_48);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_420,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
             ,0x65);
  operator____catch_sr((char *)pLStack_40,local_48);
  lineInfo = (SourceLineInfo *)CONCAT44((int)(local_48 >> 0x20),1);
  macroName.m_size = (size_type)in_stack_fffffffffffffb80;
  macroName.m_start = (char *)in_stack_fffffffffffffb78;
  capturedExpression.m_size = sStack_30;
  capturedExpression.m_start = local_38;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)pLStack_40,macroName,lineInfo,capturedExpression,resultDisposition)
  ;
  this = Catch::operator<=<slang::parsing::Token_&,_0>((Decomposer *)lineInfo,(Token *)0x19dea3);
  Catch::AssertionHandler::handleExpr<slang::parsing::Token&>
            ((AssertionHandler *)this.m_lhs,in_stack_fffffffffffffb78);
  Catch::AssertionHandler::complete((AssertionHandler *)pLStack_40);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)pLStack_40);
  slang::parsing::Lexer::~Lexer(pLStack_40);
  return local_10;
}

Assistant:

Token lexRawToken(std::string_view text) {
    diagnostics.clear();
    auto& sm = getSourceManager();
    auto buffer = sm.assignText(text);
    Lexer lexer(buffer, alloc, diagnostics, sm);

    Token token = lexer.lex();
    REQUIRE(token);
    return token;
}